

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::SPxMainSM<double>::DuplicateColsPS::execute
          (DuplicateColsPS *this,VectorBase<double> *x,VectorBase<double> *param_2,
          VectorBase<double> *param_3,VectorBase<double> *r,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  int iVar1;
  int *piVar2;
  pointer pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  VarStatus VVar8;
  long lVar9;
  ulong uVar10;
  double *pdVar11;
  undefined8 *puVar12;
  VarStatus *pVVar13;
  pointer pdVar14;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  double extraout_XMM0_Qa_11;
  double extraout_XMM0_Qa_12;
  double dVar15;
  double extraout_XMM0_Qa_13;
  double extraout_XMM0_Qa_14;
  double extraout_XMM0_Qa_15;
  double extraout_XMM0_Qa_16;
  double extraout_XMM0_Qa_17;
  double extraout_XMM0_Qa_18;
  double extraout_XMM0_Qa_19;
  double extraout_XMM0_Qa_20;
  double extraout_XMM0_Qa_21;
  double extraout_XMM0_Qa_22;
  double extraout_XMM0_Qa_23;
  double extraout_XMM0_Qa_24;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  double local_d8;
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98 [16];
  double local_88;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  double local_68;
  undefined8 uStack_60;
  double local_58;
  ulong uStack_50;
  double local_48;
  ulong uStack_40;
  double local_30;
  
  if (this->m_isFirst != false) {
    return;
  }
  if (this->m_isLast == true) {
    lVar9 = (long)(this->m_perm).thesize;
    if (lVar9 < 1) {
      return;
    }
    piVar2 = (this->m_perm).data;
    pdVar14 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar3 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar13 = cStatus->data;
    uVar10 = lVar9 + 1;
    do {
      lVar9 = (long)piVar2[uVar10 - 2];
      if (-1 < lVar9) {
        pdVar14[uVar10 - 2] = pdVar14[lVar9];
        pdVar3[uVar10 - 2] = pdVar3[lVar9];
        pVVar13[uVar10 - 2] = pVVar13[lVar9];
      }
      uVar10 = uVar10 - 1;
    } while (1 < uVar10);
    return;
  }
  iVar1 = this->m_k;
  pVVar13 = cStatus->data;
  switch(pVVar13[iVar1]) {
  case ON_UPPER:
    pdVar14 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar14[iVar1] = this->m_upK;
    lVar9 = (long)this->m_j;
    if (this->m_scale <= 0.0) {
LAB_00223a43:
      dVar15 = this->m_loJ;
      pdVar14[lVar9] = dVar15;
      pVVar13[lVar9] = (dVar15 == this->m_upJ) + ON_LOWER;
      goto LAB_002249a0;
    }
    break;
  case ON_LOWER:
    pdVar14 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar14[iVar1] = this->m_loK;
    lVar9 = (long)this->m_j;
    if (0.0 < this->m_scale) goto LAB_00223a43;
    break;
  case FIXED:
    lVar9 = (long)this->m_j;
    (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar9] = this->m_loJ;
LAB_00223bce:
    pVVar13[lVar9] = FIXED;
    goto LAB_002249a0;
  case ZERO:
    dVar15 = this->m_loK;
    (*(this->super_PostStep)._vptr_PostStep[7])(this);
    if (ABS(dVar15) <= extraout_XMM0_Qa_01) {
      dVar19 = this->m_upK;
      (*(this->super_PostStep)._vptr_PostStep[7])(this);
      dVar15 = this->m_loK;
      if (extraout_XMM0_Qa_06 < ABS(dVar19)) goto LAB_00223c0b;
      VVar8 = FIXED;
      if ((dVar15 != this->m_upK) || (NAN(dVar15) || NAN(this->m_upK))) goto LAB_00223c0b;
    }
    else {
      dVar15 = this->m_loK;
LAB_00223c0b:
      (*(this->super_PostStep)._vptr_PostStep[7])(this);
      VVar8 = ON_LOWER;
      if (extraout_XMM0_Qa_02 < ABS(dVar15)) {
        dVar15 = this->m_upK;
        (*(this->super_PostStep)._vptr_PostStep[7])(this);
        VVar8 = ON_UPPER;
        if (extraout_XMM0_Qa_03 < ABS(dVar15)) {
          dVar15 = this->m_loK;
          (*(this->super_PostStep)._vptr_PostStep[7])(this);
          dVar19 = ABS(dVar15);
          if (dVar19 <= 0.0) {
            dVar19 = 0.0;
          }
          if (dVar19 <= 1.0) {
            dVar19 = 1.0;
          }
          if (extraout_XMM0_Qa_04 < dVar15 / dVar19) {
LAB_00223cf1:
            puVar12 = (undefined8 *)__cxa_allocate_exception(0x28);
            local_a8 = local_98;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,"XMAISM05 This should never happen.","");
            *puVar12 = &PTR__SPxException_003adbd8;
            puVar12[1] = puVar12 + 3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar12 + 1),local_a8,local_a8 + local_a0);
            *puVar12 = &PTR__SPxException_003ae9a0;
            __cxa_throw(puVar12,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          }
          dVar15 = this->m_upK;
          (*(this->super_PostStep)._vptr_PostStep[7])(this);
          dVar19 = ABS(dVar15);
          if (dVar19 <= 0.0) {
            dVar19 = 0.0;
          }
          if (dVar19 <= 1.0) {
            dVar19 = 1.0;
          }
          VVar8 = ZERO;
          if (dVar15 / dVar19 <= -extraout_XMM0_Qa_05) goto LAB_00223cf1;
        }
      }
    }
    cStatus->data[this->m_k] = VVar8;
    (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[this->m_j] = 0.0;
    dVar15 = this->m_loJ;
    (*(this->super_PostStep)._vptr_PostStep[7])(this);
    if (ABS(dVar15) <= extraout_XMM0_Qa_07) {
      dVar19 = this->m_upJ;
      (*(this->super_PostStep)._vptr_PostStep[7])(this);
      dVar15 = this->m_loJ;
      if (ABS(dVar19) <= extraout_XMM0_Qa_12) {
        if ((dVar15 == this->m_upJ) && (!NAN(dVar15) && !NAN(this->m_upJ))) {
          lVar9 = (long)this->m_j;
          pVVar13 = cStatus->data;
          goto LAB_00223bce;
        }
      }
    }
    else {
      dVar15 = this->m_loJ;
    }
    (*(this->super_PostStep)._vptr_PostStep[7])(this);
    if (ABS(dVar15) <= extraout_XMM0_Qa_08) {
      lVar9 = (long)this->m_j;
      cStatus->data[lVar9] = ON_LOWER;
    }
    else {
      dVar15 = this->m_upJ;
      (*(this->super_PostStep)._vptr_PostStep[7])(this);
      if (extraout_XMM0_Qa_09 < ABS(dVar15)) {
        dVar15 = this->m_loJ;
        (*(this->super_PostStep)._vptr_PostStep[7])(this);
        dVar19 = ABS(dVar15);
        if (dVar19 <= 0.0) {
          dVar19 = 0.0;
        }
        if (dVar19 <= 1.0) {
          dVar19 = 1.0;
        }
        if (dVar15 / dVar19 <= extraout_XMM0_Qa_10) {
          dVar15 = this->m_upJ;
          (*(this->super_PostStep)._vptr_PostStep[7])(this);
          dVar19 = ABS(dVar15);
          if (dVar19 <= 0.0) {
            dVar19 = 0.0;
          }
          if (dVar19 <= 1.0) {
            dVar19 = 1.0;
          }
          if (-extraout_XMM0_Qa_11 < dVar15 / dVar19) {
            lVar9 = (long)this->m_j;
            cStatus->data[lVar9] = ZERO;
            goto LAB_002249a0;
          }
        }
        puVar12 = (undefined8 *)__cxa_allocate_exception(0x28);
        local_a8 = local_98;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"XMAISM06 This should never happen.","");
        *puVar12 = &PTR__SPxException_003adbd8;
        puVar12[1] = puVar12 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar12 + 1),local_a8,local_a8 + local_a0);
        *puVar12 = &PTR__SPxException_003ae9a0;
        __cxa_throw(puVar12,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      }
      lVar9 = (long)this->m_j;
      cStatus->data[lVar9] = ON_UPPER;
    }
    goto LAB_002249a0;
  case BASIC:
    local_48 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar1];
    dVar15 = this->m_loK;
    dVar19 = this->m_upK;
    uStack_40 = 0;
    auVar16._0_8_ = ABS(local_48);
    auVar16._8_8_ = ABS(local_48);
    auVar17._8_8_ = ABS(dVar19);
    auVar17._0_8_ = ABS(dVar15);
    auVar17 = maxpd(auVar16,auVar17);
    auVar4._8_8_ = -(ulong)(auVar17._8_8_ < 1.0);
    auVar4._0_8_ = -(ulong)(auVar17._0_8_ < 1.0);
    uVar7 = movmskpd(iVar1,auVar4);
    local_d8 = 1.0;
    local_78 = ZEXT816(0x3ff0000000000000);
    if ((uVar7 & 1) == 0) {
      local_78 = auVar17;
    }
    if ((uVar7 & 2) == 0) {
      local_d8 = auVar17._8_8_;
    }
    (*(this->super_PostStep)._vptr_PostStep[7])(this);
    local_58 = extraout_XMM0_Qa;
    (*(this->super_PostStep)._vptr_PostStep[7])(this);
    dVar21 = this->m_loJ;
    local_30 = extraout_XMM0_Qa_00;
    ::soplex::infinity::__tls_init();
    pdVar11 = (double *)__tls_get_addr(&PTR_003b4b70);
    local_88 = *pdVar11;
    local_68 = -local_88;
    uStack_60 = 0x8000000000000000;
    uStack_80 = 0;
    if ((((dVar21 <= local_68) &&
         (dVar21 = this->m_upJ, ::soplex::infinity::__tls_init(), local_88 <= dVar21)) &&
        (dVar21 = this->m_loK, ::soplex::infinity::__tls_init(), dVar21 <= local_68)) &&
       (dVar21 = this->m_upK, ::soplex::infinity::__tls_init(), local_88 <= dVar21)) {
      lVar9 = (long)this->m_j;
      cStatus->data[lVar9] = ZERO;
      (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar9] = 0.0;
      goto LAB_002249a0;
    }
    auVar18._8_8_ = dVar15;
    auVar18._0_8_ = local_48;
    auVar5._8_8_ = local_78._0_8_;
    auVar5._0_8_ = local_78._0_8_;
    auVar17 = divpd(auVar18,auVar5);
    dVar21 = auVar17._8_8_;
    dVar15 = auVar17._0_8_ - dVar21;
    auVar22._8_8_ = dVar19;
    auVar22._0_8_ = local_48;
    auVar6._8_8_ = local_d8;
    auVar6._0_8_ = local_d8;
    auVar17 = divpd(auVar22,auVar6);
    dVar19 = auVar17._8_8_;
    local_48 = auVar17._0_8_ - dVar19;
    local_58 = (double)(~-(ulong)(ABS(dVar15) <= local_58) & (ulong)dVar15);
    uStack_50 = ~(ulong)ABS(dVar21) & (ulong)dVar21;
    local_48 = (double)(~-(ulong)(ABS(local_48) <= local_30) & (ulong)local_48);
    uStack_40 = ~(ulong)ABS(dVar19) & (ulong)dVar19;
    dVar15 = this->m_scale;
    dVar19 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[this->m_k];
    if (dVar15 <= 0.0) {
      dVar21 = this->m_upK + dVar15 * this->m_loJ;
      (*(this->super_PostStep)._vptr_PostStep[7])(this);
      dVar23 = ABS(dVar21);
      dVar15 = ABS(dVar19);
      if (ABS(dVar19) <= dVar23) {
        dVar15 = dVar23;
      }
      if (dVar15 <= 1.0) {
        dVar15 = 1.0;
      }
      if ((dVar19 - dVar21) / dVar15 <= -extraout_XMM0_Qa_19) {
        dVar15 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[this->m_k];
        dVar21 = this->m_scale * this->m_loJ + this->m_loK;
        (*(this->super_PostStep)._vptr_PostStep[7])(this);
        dVar19 = ABS(dVar15);
        dVar23 = ABS(dVar21);
        if (dVar19 <= dVar23) {
          dVar19 = dVar23;
        }
        if (dVar19 <= 1.0) {
          dVar19 = 1.0;
        }
        if ((-extraout_XMM0_Qa_20 < (dVar15 - dVar21) / dVar19) &&
           (dVar15 = this->m_loJ, ::soplex::infinity::__tls_init(), local_68 < dVar15))
        goto LAB_00224553;
        dVar15 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[this->m_k];
        dVar21 = this->m_scale * this->m_upJ + this->m_upK;
        (*(this->super_PostStep)._vptr_PostStep[7])(this);
        dVar19 = ABS(dVar15);
        dVar23 = ABS(dVar21);
        if (dVar19 <= dVar23) {
          dVar19 = dVar23;
        }
        if (dVar19 <= 1.0) {
          dVar19 = 1.0;
        }
        if ((-extraout_XMM0_Qa_21 < (dVar15 - dVar21) / dVar19) &&
           (dVar15 = this->m_upK, ::soplex::infinity::__tls_init(), dVar15 < local_88))
        goto LAB_002246c8;
        dVar15 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[this->m_k];
        dVar21 = this->m_scale * this->m_upJ + this->m_loK;
        (*(this->super_PostStep)._vptr_PostStep[7])(this);
        dVar19 = ABS(dVar15);
        dVar23 = ABS(dVar21);
        if (dVar19 <= dVar23) {
          dVar19 = dVar23;
        }
        if (dVar19 <= 1.0) {
          dVar19 = 1.0;
        }
        dVar23 = this->m_upJ;
        dVar20 = dVar23;
        if ((dVar15 - dVar21) / dVar19 <= -extraout_XMM0_Qa_22) {
LAB_002247e4:
          dVar15 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[this->m_k];
          dVar21 = dVar20 * this->m_scale + this->m_loK;
          (*(this->super_PostStep)._vptr_PostStep[7])(this);
          dVar19 = ABS(dVar15);
          dVar23 = ABS(dVar21);
          if (dVar19 <= dVar23) {
            dVar19 = dVar23;
          }
          if (dVar19 <= 1.0) {
            dVar19 = 1.0;
          }
          dVar23 = this->m_loK;
          dVar20 = dVar23;
          if ((dVar15 - dVar21) / dVar19 <= -extraout_XMM0_Qa_23) {
LAB_002248e0:
            dVar15 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[this->m_k];
            local_78._8_8_ = 0;
            local_78._0_8_ = this->m_scale * this->m_upJ + dVar20;
            (*(this->super_PostStep)._vptr_PostStep[7])(this);
            dVar19 = ABS(dVar15);
            if (dVar19 <= ABS((double)local_78._0_8_)) {
              dVar19 = ABS((double)local_78._0_8_);
            }
            if (dVar19 <= 1.0) {
              dVar19 = 1.0;
            }
            if (-extraout_XMM0_Qa_24 < (dVar15 - (double)local_78._0_8_) / dVar19) {
              puVar12 = (undefined8 *)__cxa_allocate_exception(0x28);
              local_a8 = local_98;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_a8,"XMAISM09 This should never happen.","");
              *puVar12 = &PTR__SPxException_003adbd8;
              puVar12[1] = puVar12 + 3;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)(puVar12 + 1),local_a8,local_a8 + local_a0);
              *puVar12 = &PTR__SPxException_003ae9a0;
              __cxa_throw(puVar12,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
            }
            goto LAB_00224959;
          }
          ::soplex::infinity::__tls_init();
          dVar20 = this->m_loK;
          if (dVar23 <= local_68) goto LAB_002248e0;
LAB_00224887:
          iVar1 = this->m_k;
          pVVar13 = cStatus->data;
          pVVar13[iVar1] = (this->m_upK == dVar20) + ON_LOWER;
          pdVar14 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar14[iVar1] = dVar20;
          lVar9 = (long)this->m_j;
          pVVar13[lVar9] = BASIC;
          pdVar14[lVar9] = ((double)local_78._0_8_ * local_58) / this->m_scale;
          goto LAB_002249a0;
        }
        ::soplex::infinity::__tls_init();
        dVar20 = this->m_upJ;
        if (local_88 <= dVar23) goto LAB_002247e4;
        goto LAB_0022495f;
      }
LAB_00224553:
      dVar20 = this->m_loJ;
LAB_00224559:
      lVar9 = (long)this->m_j;
      cStatus->data[lVar9] = (this->m_upJ == dVar20) + ON_LOWER;
    }
    else {
      dVar21 = this->m_upK + dVar15 * this->m_upJ;
      (*(this->super_PostStep)._vptr_PostStep[7])(this);
      dVar23 = ABS(dVar21);
      dVar15 = ABS(dVar19);
      if (ABS(dVar19) <= dVar23) {
        dVar15 = dVar23;
      }
      if (dVar15 <= 1.0) {
        dVar15 = 1.0;
      }
      if ((dVar19 - dVar21) / dVar15 <= -extraout_XMM0_Qa_13) {
        dVar15 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[this->m_k];
        dVar21 = this->m_scale * this->m_upJ + this->m_loK;
        (*(this->super_PostStep)._vptr_PostStep[7])(this);
        dVar19 = ABS(dVar15);
        dVar23 = ABS(dVar21);
        if (dVar19 <= dVar23) {
          dVar19 = dVar23;
        }
        if (dVar19 <= 1.0) {
          dVar19 = 1.0;
        }
        if (((dVar15 - dVar21) / dVar19 <= -extraout_XMM0_Qa_14) ||
           (dVar15 = this->m_upJ, ::soplex::infinity::__tls_init(), local_88 <= dVar15)) {
          dVar15 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[this->m_k];
          dVar21 = this->m_scale * this->m_loJ + this->m_upK;
          (*(this->super_PostStep)._vptr_PostStep[7])(this);
          dVar19 = ABS(dVar15);
          dVar23 = ABS(dVar21);
          if (dVar19 <= dVar23) {
            dVar19 = dVar23;
          }
          if (dVar19 <= 1.0) {
            dVar19 = 1.0;
          }
          if ((-extraout_XMM0_Qa_15 < (dVar15 - dVar21) / dVar19) &&
             (dVar15 = this->m_upK, ::soplex::infinity::__tls_init(), dVar15 < local_88)) {
LAB_002246c8:
            dVar15 = this->m_upK;
            iVar1 = this->m_k;
            pVVar13 = cStatus->data;
            pVVar13[iVar1] = (-(uint)(this->m_loK == dVar15) & 1) * 2;
            pdVar14 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar14[iVar1] = dVar15;
            lVar9 = (long)this->m_j;
            pVVar13[lVar9] = BASIC;
            pdVar14[lVar9] = (local_d8 * local_48) / this->m_scale;
            goto LAB_002249a0;
          }
          dVar15 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[this->m_k];
          dVar21 = this->m_scale * this->m_loJ + this->m_loK;
          (*(this->super_PostStep)._vptr_PostStep[7])(this);
          dVar19 = ABS(dVar15);
          dVar23 = ABS(dVar21);
          if (dVar19 <= dVar23) {
            dVar19 = dVar23;
          }
          if (dVar19 <= 1.0) {
            dVar19 = 1.0;
          }
          dVar23 = this->m_loJ;
          dVar20 = dVar23;
          if ((dVar15 - dVar21) / dVar19 <= -extraout_XMM0_Qa_16) {
LAB_0022434d:
            dVar15 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[this->m_k];
            dVar21 = dVar20 * this->m_scale + this->m_loK;
            (*(this->super_PostStep)._vptr_PostStep[7])(this);
            dVar19 = ABS(dVar15);
            dVar23 = ABS(dVar21);
            if (dVar19 <= dVar23) {
              dVar19 = dVar23;
            }
            if (dVar19 <= 1.0) {
              dVar19 = 1.0;
            }
            dVar23 = this->m_loK;
            dVar20 = dVar23;
            if (-extraout_XMM0_Qa_17 < (dVar15 - dVar21) / dVar19) {
              ::soplex::infinity::__tls_init();
              dVar20 = this->m_loK;
              if (local_68 < dVar23) goto LAB_00224887;
            }
            dVar15 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[this->m_k];
            local_78._8_8_ = 0;
            local_78._0_8_ = this->m_scale * this->m_loJ + dVar20;
            (*(this->super_PostStep)._vptr_PostStep[7])(this);
            dVar19 = ABS(dVar15);
            if (dVar19 <= ABS((double)local_78._0_8_)) {
              dVar19 = ABS((double)local_78._0_8_);
            }
            if (dVar19 <= 1.0) {
              dVar19 = 1.0;
            }
            if (-extraout_XMM0_Qa_18 < (dVar15 - (double)local_78._0_8_) / dVar19) {
              puVar12 = (undefined8 *)__cxa_allocate_exception(0x28);
              local_a8 = local_98;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_a8,"XMAISM08 This should never happen.","");
              *puVar12 = &PTR__SPxException_003adbd8;
              puVar12[1] = puVar12 + 3;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)(puVar12 + 1),local_a8,local_a8 + local_a0);
              *puVar12 = &PTR__SPxException_003ae9a0;
              __cxa_throw(puVar12,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
            }
            goto LAB_00224553;
          }
          ::soplex::infinity::__tls_init();
          dVar20 = this->m_loJ;
          if (dVar23 <= local_68) goto LAB_0022434d;
          goto LAB_00224559;
        }
      }
LAB_00224959:
      dVar20 = this->m_upJ;
LAB_0022495f:
      lVar9 = (long)this->m_j;
      cStatus->data[lVar9] = (-(uint)(this->m_loJ == dVar20) & 1) * 2;
    }
    pdVar14 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar14[lVar9] = dVar20;
    pdVar14[this->m_k] = pdVar14[this->m_k] - dVar20 * this->m_scale;
    goto LAB_002249a0;
  default:
    lVar9 = (long)this->m_j;
    goto LAB_002249a0;
  }
  dVar15 = this->m_upJ;
  pdVar14[lVar9] = dVar15;
  pVVar13[lVar9] = (-(uint)(dVar15 == this->m_loJ) & 1) * 2;
LAB_002249a0:
  pdVar14 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar14[lVar9] = this->m_scale * pdVar14[this->m_k];
  return;
}

Assistant:

void SPxMainSM<R>::DuplicateColsPS::execute(VectorBase<R>& x,
      VectorBase<R>&,
      VectorBase<R>&,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{

   if(m_isFirst)
   {
#ifdef SOPLEX_CHECK_BASIS_DIM

      if(!this->checkBasisDim(rStatus, cStatus))
      {
         throw SPxInternalCodeException("XMAISM25 Dimension doesn't match after this step.");
      }

#endif
      return;
   }


   // correcting the change of idx by deletion of the columns:
   if(m_isLast)
   {
      for(int i = m_perm.size() - 1; i >= 0; --i)
      {
         if(m_perm[i] >= 0)
         {
            int cIdx_new = m_perm[i];
            int cIdx = i;
            x[cIdx] = x[cIdx_new];
            r[cIdx] = r[cIdx_new];
            cStatus[cIdx] = cStatus[cIdx_new];
         }
      }

      return;
   }

   // primal & basis:
   SOPLEX_ASSERT_WARN("WMAISM03", isNotZero(m_scale, this->epsilon()));

   if(cStatus[m_k] == SPxSolverBase<R>::ON_LOWER)
   {
      x[m_k] = m_loK;

      if(m_scale > 0)
      {
         x[m_j]       = m_loJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
      else
      {
         x[m_j]       = m_upJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::ON_UPPER)
   {
      x[m_k] = m_upK;

      if(m_scale > 0)
      {
         x[m_j]       = m_upJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
      else
      {
         x[m_j]       = m_loJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::FIXED)
   {
      // => x[m_k] and x[m_j] are also fixed before the corresponding preprocessing step
      x[m_j]       = m_loJ;
      cStatus[m_j] = SPxSolverBase<R>::FIXED;
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::ZERO)
   {
      /* we only aggregate duplicate columns if 0 is contained in their bounds, so we can handle this case properly */
      assert(isZero(x[m_k], this->epsilon()));
      assert(LErel(m_loJ, R(0.0), this->epsilon()));
      assert(GErel(m_upJ, R(0.0), this->epsilon()));
      assert(LErel(m_loK, R(0.0), this->epsilon()));
      assert(GErel(m_upK, R(0.0), this->epsilon()));

      if(isZero(m_loK, this->epsilon()) && isZero(m_upK, this->epsilon()) && m_loK == m_upK)
         cStatus[m_k] = SPxSolverBase<R>::FIXED;
      else if(isZero(m_loK, this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ON_LOWER;
      else if(isZero(m_upK, this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ON_UPPER;
      else if(LErel(m_loK, R(0.0), this->epsilon()) && GErel(m_upK, R(0.0), this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM05 This should never happen.");

      x[m_j] = 0.0;

      if(isZero(m_loJ, this->epsilon()) && isZero(m_upJ, this->epsilon()) && m_loJ == m_upJ)
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      else if(isZero(m_loJ, this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      else if(isZero(m_upJ, this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      else if(LErel(m_loJ, R(0.0), this->epsilon()) && GErel(m_upJ, R(0.0), this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM06 This should never happen.");
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::BASIC)
   {
      R scale1 = maxAbs(x[m_k], m_loK);
      R scale2 = maxAbs(x[m_k], m_upK);

      if(scale1 < 1.0)
         scale1 = 1.0;

      if(scale2 < 1.0)
         scale2 = 1.0;

      R z1 = (x[m_k] / scale1) - (m_loK / scale1);
      R z2 = (x[m_k] / scale2) - (m_upK / scale2);

      if(isZero(z1, this->epsilon()))
         z1 = 0.0;

      if(isZero(z2, this->epsilon()))
         z2 = 0.0;

      if(m_loJ <= R(-infinity) && m_upJ >= R(infinity) && m_loK <= R(-infinity) && m_upK >= R(infinity))
      {
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
         x[m_j] = 0.0;
      }
      else if(m_scale > 0.0)
      {
         if(GErel(x[m_k], m_upK + m_scale * m_upJ, this->epsilon()))
         {
            assert(m_upJ < R(infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_upJ < R(infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_upK + m_scale * m_loJ, this->epsilon()) && m_upK < R(infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_k] = m_upK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z2 * scale2 / m_scale;
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loJ > R(-infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loK > R(-infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_k] = m_loK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z1 * scale1 / m_scale;
         }
         else if(LTrel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()))
         {
            assert(m_loJ > R(-infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else
         {
            throw SPxInternalCodeException("XMAISM08 This should never happen.");
         }
      }
      else
      {
         assert(m_scale < 0.0);

         if(GErel(x[m_k], m_upK + m_scale * m_loJ, this->epsilon()))
         {
            assert(m_loJ > R(-infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loJ > R(-infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_upK + m_scale * m_upJ, this->epsilon()) && m_upK < R(infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_k] = m_upK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z2 * scale2 / m_scale;
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_upJ < R(infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_loK > R(-infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_k] = m_loK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z1 * scale1 / m_scale;
         }
         else if(LTrel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()))
         {
            assert(m_upJ < R(infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else
         {
            throw SPxInternalCodeException("XMAISM09 This should never happen.");
         }
      }
   }

   // dual:
   r[m_j] = m_scale * r[m_k];
}